

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall
CConnman::Bind(CConnman *this,CService *addr_,uint flags,NetPermissionFlags permissions)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  uint in_EDX;
  long in_RDI;
  long in_FS_OFFSET;
  bilingual_str strError;
  CService addr;
  NetPermissionFlags in_stack_0000010c;
  NetPermissionFlags in_stack_fffffffffffffef8;
  NetPermissionFlags in_stack_fffffffffffffefc;
  string *in_stack_ffffffffffffff00;
  undefined5 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  CClientUIInterface *this_00;
  CService *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  bool local_92;
  allocator<char> local_91 [9];
  CService *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffffc4;
  bilingual_str *in_stack_ffffffffffffffe0;
  CService *in_stack_ffffffffffffffe8;
  CConnman *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeFlipIPv6toCJDNS(in_stack_ffffffffffffff30);
  bilingual_str::bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  uVar2 = BindListenPort(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                         in_stack_ffffffffffffffe0,in_stack_0000010c);
  if ((bool)uVar2) {
    bVar3 = CNetAddr::IsRoutable
                      ((CNetAddr *)
                       CONCAT17(in_stack_ffffffffffffff0f,
                                CONCAT16(in_stack_ffffffffffffff0e,
                                         CONCAT15(in_stack_ffffffffffffff0d,
                                                  in_stack_ffffffffffffff08))));
    if ((((bVar3) && ((fDiscover & 1U) != 0)) && ((in_EDX & 2) == 0)) &&
       (bVar3 = NetPermissions::HasFlag(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8), !bVar3
       )) {
      AddLocal(in_stack_ffffffffffffff78,in_stack_ffffffffffffffc4);
    }
    local_92 = true;
  }
  else {
    if (((in_EDX & 1) != 0) && (*(long *)(in_RDI + 0x260) != 0)) {
      this_00 = *(CClientUIInterface **)(in_RDI + 0x260);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff48,
                 (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (allocator<char> *)CONCAT17(uVar2,in_stack_ffffffffffffff38));
      CClientUIInterface::ThreadSafeMessageBox
                (this_00,(bilingual_str *)
                         CONCAT17(in_stack_ffffffffffffff0f,
                                  CONCAT16(in_stack_ffffffffffffff0e,
                                           CONCAT15(in_stack_ffffffffffffff0d,
                                                    in_stack_ffffffffffffff08))),
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::allocator<char>::~allocator(local_91);
    }
    local_92 = false;
  }
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_92;
}

Assistant:

bool CConnman::Bind(const CService& addr_, unsigned int flags, NetPermissionFlags permissions)
{
    const CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    bilingual_str strError;
    if (!BindListenPort(addr, strError, permissions)) {
        if ((flags & BF_REPORT_ERROR) && m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(strError, "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }

    if (addr.IsRoutable() && fDiscover && !(flags & BF_DONT_ADVERTISE) && !NetPermissions::HasFlag(permissions, NetPermissionFlags::NoBan)) {
        AddLocal(addr, LOCAL_BIND);
    }

    return true;
}